

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesReader.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
aeron::archive::util::PropertiesReader::parseLine
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PropertiesReader *this,string *line)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  runtime_error *prVar4;
  string local_118 [39];
  undefined1 local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78 [39];
  byte local_51;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  size_t pos;
  size_t i;
  anon_enum_32 state;
  string *line_local;
  PropertiesReader *this_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *result;
  
  i._4_4_ = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__);
  pos = 0;
  __range2 = (string *)0x0;
  __end2._M_current = (char *)::std::__cxx11::string::begin();
  _Stack_50._M_current = (char *)::std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0), bVar1) {
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
    local_51 = *pbVar3;
    if (i._4_4_ == 0) {
      iVar2 = isspace((uint)local_51);
      if (iVar2 == 0) {
        if (local_51 == 0x23) {
          return __return_storage_ptr__;
        }
        i._4_4_ = 1;
        __range2 = (string *)pos;
      }
    }
    else {
      if (i._4_4_ == 1) {
        if (local_51 == 0x3d) {
          i._4_4_ = 2;
          ::std::__cxx11::string::string(local_78,(string *)line,(ulong)__range2,pos);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_78);
          ::std::__cxx11::string::~string(local_78);
          anon_unknown.dwarf_a2cef::rtrim(&__return_storage_ptr__->first);
          __range2 = (string *)(pos + 1);
          goto LAB_001c80a0;
        }
      }
      else if (i._4_4_ != 2) {
        local_c9 = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::to_string(&local_c8,i._4_4_);
        ::std::operator+(&local_a8,"unknown state: ",&local_c8);
        ::std::runtime_error::runtime_error(prVar4,(string *)&local_a8);
        local_c9 = 0;
        __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_51 == 0x23) break;
    }
LAB_001c80a0:
    pos = pos + 1;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  if (i._4_4_ != 1) {
    if (i._4_4_ == 2) {
      ::std::__cxx11::string::string(local_118,(string *)line,(ulong)__range2,pos);
      ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->second,local_118);
      ::std::__cxx11::string::~string(local_118);
      anon_unknown.dwarf_a2cef::trim(&__return_storage_ptr__->second);
    }
    return __return_storage_ptr__;
  }
  local_f1 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_f0,"no value: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line);
  ::std::runtime_error::runtime_error(prVar4,(string *)&local_f0);
  local_f1 = 0;
  __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::pair<std::string, std::string> PropertiesReader::parseLine(const std::string& line) {
    enum { START, KEY, VALUE } state;
    state = START;

    std::pair<std::string, std::string> result;

    std::size_t i = 0, pos = 0;
    for (char c : line) {
        if (state == START) {
            if (!std::isspace((unsigned char)c)) {
                if (c == '#') {
                    return result;
                } else {
                    state = KEY;
                    pos = i;
                }
            }
        } else if (state == KEY) {
            if (c == '=') {
                state = VALUE;
                result.first = std::string(line, pos, i);
                rtrim(result.first);
                pos = i + 1;
            } else if (c == '#') {
                break;
            }
        } else if (state == VALUE) {
            if (c == '#') {
                break;
            }
        } else {
            throw std::runtime_error("unknown state: " + std::to_string(state));
        }
        ++i;
    }

    if (state == KEY) {
        throw std::runtime_error("no value: " + line);
    } else if (state == VALUE) {
        result.second = std::string(line, pos, i);
        trim(result.second);
    }

    return result;
}